

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O2

int sptk::snack::xget_window
              (float *dout,int n,int type,int *n0p,float **dinp,int *wsizep,float **windp)

{
  int iVar1;
  float *din;
  long lVar2;
  
  din = *dinp;
  if (*n0p < n) {
    free(din);
    din = (float *)malloc((long)n << 2);
    if (din == (float *)0x0) {
      fwrite("Allocation problems in xget_window()\n",0x25,1,_stderr);
      return 0;
    }
    lVar2 = 0;
    iVar1 = 0;
    if (0 < n) {
      iVar1 = n;
    }
    for (; iVar1 != (int)lVar2; lVar2 = lVar2 + 1) {
      din[lVar2] = 1.0;
    }
    *dinp = din;
    *n0p = n;
  }
  iVar1 = window(din,dout,n,0.0,type,wsizep,windp);
  return iVar1;
}

Assistant:

int xget_window(float *dout, int n, int type, int *n0p, float **dinp,
                int *wsizep, float **windp)
#endif
{
#if 0
  static float *din = NULL;
  static int n0 = 0;
#else
  float *din = *dinp;
  int n0 = *n0p;
#endif
  float preemp = 0.0;

  if(n > n0) {
    register float *p;
    register int i;
    
    if(din) ckfree((void *)din);
    din = NULL;
    if(!(din = (float*)ckalloc(sizeof(float)*n))) {
      Fprintf(stderr,"Allocation problems in xget_window()\n");
      return(FALSE);
    }
    for(i=0, p=din; i++ < n; ) *p++ = 1;
    n0 = n;
#if 1
    *dinp = din;
    *n0p = n0;
#endif
  }
#if 0
  return(window(din, dout, n, preemp, type));
#else
  return(window(din, dout, n, preemp, type, wsizep, windp));
#endif
}